

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyplayer.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *__s1;
  bool bVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  FILE *__s;
  ulong uVar5;
  double dVar6;
  int local_84;
  int local_80;
  int local_7c;
  FILE *fout;
  char *v2m_filename;
  uint uStack_58;
  char ch;
  uint eofcnt;
  uint read;
  uint blksz;
  uint64_t size;
  FILE *file;
  uchar *theTune;
  char *foutput;
  int local_28;
  int fhelp;
  int fkey;
  int fouts;
  int startPos;
  int opt;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  _startPos = argv;
  argv_local._0_4_ = argc;
  V2mPlayerTitle();
  fkey = 0;
  fhelp = 0;
  local_28 = 0;
  foutput._4_4_ = 0;
  while (fouts = getopt((int)argv_local,_startPos,"ko:hs:g:f:"), fouts != -1) {
    switch(fouts) {
    case 0x3a:
      printf("option needs a value\n");
      break;
    case 0x3f:
      printf("unknown option: %c\n",(ulong)_optopt);
      break;
    case 0x66:
      local_80 = atoi((char *)_optarg);
      if (local_80 < 0x40) {
        local_7c = 0x40;
      }
      else {
        if (0x3fff < local_80) {
          local_80 = 0x4000;
        }
        local_7c = local_80;
      }
      frame_size = local_7c;
      break;
    case 0x67:
      dVar6 = atof((char *)_optarg);
      gain = (float)dVar6;
      break;
    case 0x68:
      foutput._4_4_ = 1;
      break;
    case 0x6b:
      local_28 = 1;
      break;
    case 0x6f:
      theTune = _optarg;
      fhelp = 1;
      break;
    case 0x73:
      dVar6 = atof((char *)_optarg);
      local_84 = (int)(dVar6 * 1000.0);
      if (local_84 < 0) {
        local_84 = 0;
      }
      fkey = local_84;
    }
  }
  if ((foutput._4_4_ < 1) && (_optind + 1 <= (int)argv_local)) {
    eofcnt = 0x1000;
    uStack_58 = 0;
    __s1 = _startPos[_optind];
    iVar2 = strcmp(__s1,"-");
    if (iVar2 == 0) {
      size = (uint64_t)_stdin;
      v2m_filename._4_4_ = 0;
      _read = (size_t)eofcnt;
      file = (FILE *)calloc(1,_read);
      if (file == (FILE *)0x0) {
        fprintf(_stderr,"Error memory allocator: %Ld b\n",_read);
        exit(1);
      }
      iVar2 = getc(_stdin);
      v2m_filename._3_1_ = SUB41(iVar2,0);
      while (v2m_filename._3_1_ != (FILE)0xff || v2m_filename._4_4_ < eofcnt) {
        if (v2m_filename._3_1_ == (FILE)0xff) {
          v2m_filename._4_4_ = v2m_filename._4_4_ + 1;
        }
        else {
          v2m_filename._4_4_ = 0;
        }
        if (uStack_58 == _read) {
          _read = eofcnt + _read;
          file = (FILE *)realloc(file,_read);
          if (file == (FILE *)0x0) {
            fprintf(_stderr,"Error memory allocator: %lu b\n",_read);
            exit(1);
          }
        }
        file[uStack_58] = v2m_filename._3_1_;
        uStack_58 = uStack_58 + 1;
        iVar2 = getc(_stdin);
        v2m_filename._3_1_ = SUB41(iVar2,0);
      }
      uStack_58 = uStack_58 - v2m_filename._4_4_;
      printf("Now Playing: stdin(%d[%lu])\n",(ulong)uStack_58,_read);
      _read = (size_t)uStack_58;
    }
    else {
      size = (uint64_t)fopen(__s1,"rb");
      if ((FILE *)size == (FILE *)0x0) {
        fprintf(_stderr,"Failed to open %s\n",__s1);
        return 1;
      }
      fseek((FILE *)size,0,2);
      _read = ftell((FILE *)size);
      fseek((FILE *)size,0,0);
      printf("Now Playing: %s\n",__s1);
      file = (FILE *)calloc(1,_read);
      if (file == (FILE *)0x0) {
        fprintf(_stderr,"Error memory allocator: %Ld b\n",_read);
        exit(1);
      }
      sVar4 = fread(file,1,_read,(FILE *)size);
      uStack_58 = (uint)sVar4;
    }
    if (_read == uStack_58) {
      fclose((FILE *)size);
      file = (FILE *)check_and_convert((uchar *)file,&stack0xffffffffffffffa8);
      if (file == (FILE *)0x0) {
        fprintf(_stderr,"Error convert to newest\n");
        exit(1);
      }
      printf("Convert: %d b\n",(ulong)uStack_58);
      uVar3 = uStack_58;
      do {
        uStack_58 = uVar3;
        uVar3 = uStack_58 - 1;
      } while (file[uStack_58] == (FILE)0x0);
      uStack_58 = uStack_58 + 1;
      printf("Strip: %d b\n",(ulong)uStack_58);
      if (fhelp != 0) {
        __s = fopen((char *)theTune,"a");
        if (__s == (FILE *)0x0) {
          fprintf(_stderr,"Failed to open %s\n",theTune);
          return 1;
        }
        fwrite(file,1,(ulong)uStack_58,__s);
        fclose(__s);
      }
      V2MPlayer::Init(&player,1000);
      V2MPlayer::Open(&player,(uint)file);
      bVar1 = init_sdl();
      if (bVar1) {
        V2MPlayer::Play(0x104150);
        SDL_PauseAudioDevice(dev,0);
        uVar3 = V2MPlayer::Length();
        printf("Length: %d\n",(ulong)uVar3);
        if (local_28 < 1) {
          while (uVar5 = V2MPlayer::IsPlaying(), (uVar5 & 1) != 0) {
            sleep(1);
          }
        }
        else {
          printf("\n\npress Enter to quit\n");
          getc(_stdin);
        }
        SDL_PauseAudioDevice(dev,1);
        SDL_Quit();
        V2MPlayer::Close();
        free(file);
        argv_local._4_4_ = 0;
      }
      else {
        argv_local._4_4_ = 1;
      }
    }
    else {
      fprintf(_stderr,"Invalid read size\n");
      argv_local._4_4_ = 1;
    }
  }
  else {
    V2mPlayerUsage();
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv)
{
    V2mPlayerTitle();
    int opt;
    int startPos = 0;
    int fouts = 0;
    int fkey = 0;
    int fhelp = 0;
    char *foutput;
    while ((opt = getopt(argc, argv, "ko:hs:g:f:")) != -1)
    {
        switch(opt)
        {
            case 'k':
                fkey = 1;
                break;
            case 'o':
                foutput = optarg;
                fouts = 1;
                break;
            case 'h':
                fhelp = 1;
                break;
            case 'g':
                gain = atof(optarg);
                break;
            case 'f':
                frame_size = atoi(optarg);
                frame_size = (frame_size < 64) ? 64 : ((frame_size < 16384) ? frame_size : 16384);
                break;
            case 's':
                startPos = (int)(atof(optarg) * 1000);
                startPos = (startPos < 0) ? 0 : startPos;
                break;
            case ':':
                printf("option needs a value\n");
                break;
            case '?':
                printf("unknown option: %c\n", optopt);
                break;
        }
    }

    if((fhelp > 0)||(optind + 1 > argc))
    {
        V2mPlayerUsage();
        return 1;
    }
    unsigned char* theTune;
    FILE* file;
    uint64_t size;
    unsigned int blksz = 4096, read = 0, eofcnt = 0;
    char ch;
    const char *v2m_filename = argv[optind];
    if (strcmp(v2m_filename, "-") == 0)
    {
        file = stdin;
        eofcnt = 0;
        size = blksz;
        theTune = (unsigned char*) calloc(1, size);
        if (theTune == NULL)
        {
            fprintf(stderr, "Error memory allocator: %Ld b\n", size);
            exit(1);
        }
        ch = getc(stdin);
        while (ch != EOF || eofcnt < blksz)
        {
            if (ch != EOF) {eofcnt = 0;} else {eofcnt++;}
            if (read == size)
            {
                size += blksz;
                theTune = (unsigned char*)realloc(theTune, size * sizeof(unsigned char));
                if (theTune == NULL)
                {
                    fprintf(stderr, "Error memory allocator: %lu b\n", size);
                    exit(1);
                }
            }
            theTune[read] = ch;
            read++;
            ch = getc(stdin);
        }
        read -= eofcnt;

        printf("Now Playing: stdin(%d[%lu])\n", read, size);
        size = read;
    } else {
        file = fopen(v2m_filename, "rb");
        if (file == NULL)
        {
            fprintf(stderr, "Failed to open %s\n", v2m_filename);
            return 1;
        }

        fseek(file, 0, SEEK_END);
        size = ftell(file);
        fseek(file, 0, SEEK_SET);
        printf("Now Playing: %s\n", v2m_filename);
        theTune = (unsigned char*) calloc(1, size);
        if (theTune == NULL)
        {
            fprintf(stderr, "Error memory allocator: %Ld b\n", size);
            exit(1);
        }
        read = fread(theTune, 1, size, file);
    }
    if (size != read)
    {
        fprintf(stderr, "Invalid read size\n");
        return 1;
    }
    fclose(file);
    theTune = check_and_convert(theTune, &read);
    if (theTune == NULL)
    {
        fprintf(stderr, "Error convert to newest\n");
        exit(1);
    }
    printf("Convert: %d b\n", read);
    while (theTune[read--] == 0){}
    read++;
    read++;
    printf("Strip: %d b\n", read);

    if (fouts)
    {
        FILE* fout;
        fout = fopen(foutput, "a");
        if (fout == NULL)
        {
            fprintf(stderr, "Failed to open %s\n", foutput);
            return 1;
        }
        fwrite(theTune, 1, read, fout);
        fclose(fout);
    }

    player.Init();
    player.Open(theTune);

    if (! init_sdl()) {
        return 1;
    }

    player.Play(startPos);
    SDL_PauseAudioDevice(dev, 0);

    printf("Length: %d\n", player.Length());
    if (fkey > 0)
    {
        printf("\n\npress Enter to quit\n");
        getc(stdin);
    } else {
        while(player.IsPlaying()) { sleep(1); }
    }

    SDL_PauseAudioDevice(dev, 1);
    SDL_Quit();
    player.Close();
    free(theTune);
    return 0;
}